

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O3

ngx_int_t ngx_output_chain(ngx_output_chain_ctx_t *ctx,ngx_chain_t *in)

{
  ngx_chain_t **ppnVar1;
  byte bVar2;
  ngx_pool_t *pnVar3;
  ngx_log_t *pnVar4;
  ngx_file_t *pnVar5;
  ngx_chain_t *pnVar6;
  ngx_chain_t **ppnVar7;
  ngx_chain_t **ppnVar8;
  ushort uVar9;
  ngx_buf_t *pnVar10;
  ngx_chain_t *pnVar11;
  ngx_buf_t *pnVar12;
  u_char *puVar13;
  undefined1 *puVar14;
  ngx_output_chain_filter_pt UNRECOVERED_JUMPTABLE;
  ngx_int_t nVar15;
  ushort uVar16;
  ushort uVar17;
  ngx_chain_t **in_RCX;
  long lVar18;
  ngx_chain_t **ppnVar19;
  size_t sVar20;
  size_t sVar21;
  ngx_output_chain_ctx_t *pnVar22;
  ngx_chain_t **ppnVar23;
  ngx_output_chain_ctx_t *pnVar24;
  ngx_buf_t *pnVar25;
  ulong uVar26;
  ngx_buf_t *pnVar27;
  void *pvVar28;
  ulong size;
  ulong uVar29;
  size_t size_00;
  off_t oVar30;
  bool bVar31;
  byte bVar32;
  long local_68;
  ngx_chain_t *local_48;
  ngx_chain_t *out;
  ngx_output_chain_ctx_t *local_38;
  
  bVar32 = 0;
  ppnVar1 = &ctx->in;
  local_38 = ctx;
  if ((ctx->in == (ngx_chain_t *)0x0) && (ctx->busy == (ngx_chain_t *)0x0)) {
    if (in == (ngx_chain_t *)0x0) {
      UNRECOVERED_JUMPTABLE = ctx->output_filter;
      pvVar28 = ctx->filter_ctx;
      in = (ngx_chain_t *)0x0;
      goto LAB_001166f7;
    }
    if (in->next == (ngx_chain_t *)0x0) {
      pnVar12 = in->buf;
      uVar9 = *(ushort *)&pnVar12->field_0x48;
      if ((uVar9 & 0x10) == 0) {
        if ((uVar9 & 0xe0) == 0 || (uVar9 & 7) != 0) {
LAB_001167a2:
          bVar2 = ctx->field_0x20;
          if ((bVar2 & 1) == 0) goto LAB_001167a9;
LAB_001167bc:
          if ((((uVar9 & 7) == 0) && ((bVar2 & 8) != 0)) ||
             (((uVar9 & 6) != 0 && ((bVar2 & 0x10) != 0)))) goto LAB_0011601f;
        }
        UNRECOVERED_JUMPTABLE = ctx->output_filter;
        pvVar28 = ctx->filter_ctx;
LAB_001166f7:
        nVar15 = (*UNRECOVERED_JUMPTABLE)(pvVar28,in);
        return nVar15;
      }
      if ((pnVar12->file_last < 0x80000001) && ((pnVar12->file->field_0xc0 & 2) == 0)) {
        if (pnVar12->file_pos < 0x80000000) goto LAB_001167a2;
LAB_001167a9:
        if ((uVar9 & 7) != 0) {
          uVar9 = uVar9 & 0xffef;
          *(ushort *)&pnVar12->field_0x48 = uVar9;
          bVar2 = ctx->field_0x20;
          goto LAB_001167bc;
        }
      }
    }
  }
  else if (in == (ngx_chain_t *)0x0) goto LAB_00116105;
LAB_0011601f:
  pnVar3 = ctx->pool;
  ppnVar8 = ppnVar1;
  do {
    ppnVar23 = ppnVar8;
    ppnVar8 = &(*ppnVar23)->next;
  } while (*ppnVar23 != (ngx_chain_t *)0x0);
  in_RCX = (ngx_chain_t **)0x0;
  do {
    pnVar11 = ngx_alloc_chain_link(pnVar3);
    if (pnVar11 == (ngx_chain_t *)0x0) {
      return -1;
    }
    pnVar12 = in->buf;
    if ((((pnVar12->field_0x48 & 0x10) == 0) || (0x7fffffff < pnVar12->file_pos)) ||
       (pnVar12->file_last < 0x80000001)) {
      pnVar11->buf = pnVar12;
      in = in->next;
    }
    else {
      pnVar10 = (ngx_buf_t *)ngx_pcalloc(pnVar3,0x50);
      if (pnVar10 == (ngx_buf_t *)0x0) {
        return -1;
      }
      pnVar25 = pnVar12;
      pnVar27 = pnVar10;
      for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
        pnVar27->pos = pnVar25->pos;
        pnVar25 = (ngx_buf_t *)((long)pnVar25 + ((ulong)bVar32 * -2 + 1) * 8);
        pnVar27 = (ngx_buf_t *)((long)pnVar27 + ((ulong)bVar32 * -2 + 1) * 8);
      }
      if ((pnVar12->field_0x48 & 7) != 0) {
        puVar13 = pnVar12->pos;
        pnVar12->pos = puVar13 + (0x80000000 - pnVar12->file_pos);
        pnVar10->last = puVar13 + (0x80000000 - pnVar12->file_pos);
      }
      in_RCX = (ngx_chain_t **)0x80000000;
      pnVar12->file_pos = 0x80000000;
      pnVar10->file_last = 0x80000000;
      pnVar11->buf = pnVar10;
    }
    pnVar11->next = (ngx_chain_t *)0x0;
    *ppnVar23 = pnVar11;
    ppnVar23 = &pnVar11->next;
  } while (in != (ngx_chain_t *)0x0);
LAB_00116105:
  local_48 = (ngx_chain_t *)0x0;
  ppnVar8 = &local_38->free;
  ppnVar23 = &local_38->busy;
  local_68 = 1;
  pnVar24 = local_38;
  do {
    out._4_4_ = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    pnVar11 = *ppnVar1;
    ppnVar7 = &local_48;
    while (pnVar11 != (ngx_chain_t *)0x0) {
      while( true ) {
        pnVar12 = pnVar11->buf;
        uVar9 = *(ushort *)&pnVar12->field_0x48;
        if ((uVar9 & 7) == 0) {
          size = pnVar12->file_last - pnVar12->file_pos;
        }
        else {
          size = (long)pnVar12->last - (long)pnVar12->pos;
        }
        if (size != 0) break;
        if ((uVar9 & 0xe0) != 0 && (uVar9 & 0x17) == 0) goto LAB_00116217;
        pnVar4 = pnVar24->pool->log;
        if (1 < pnVar4->log_level) {
          ngx_log_error_core(2,pnVar4,0,"zero size buf in output t:%d r:%d f:%d %p %p-%p %p %O-%O",
                             (ulong)(uVar9 & 1),(ulong)(uVar9 >> 3 & 1),(ulong)(uVar9 >> 4 & 1),
                             pnVar12->start,pnVar12->pos,pnVar12->last,pnVar12->file,
                             pnVar12->file_pos,pnVar12->file_last);
        }
        ngx_debug_point();
        pnVar11 = (*ppnVar1)->next;
        *ppnVar1 = pnVar11;
        if (pnVar11 == (ngx_chain_t *)0x0) goto LAB_0011663c;
      }
      if ((uVar9 & 0xe0) == 0 || (uVar9 & 0x17) != 0) {
        if ((uVar9 & 0x10) != 0) {
          if ((pnVar12->file->field_0xc0 & 2) == 0) {
            if (pnVar12->file_pos < 0x80000000) goto LAB_0011622f;
            goto LAB_0011624f;
          }
LAB_0011628f:
          pnVar12 = pnVar24->buf;
          if (pnVar12 == (ngx_buf_t *)0x0) {
            pnVar11 = *ppnVar1;
            pnVar12 = pnVar11->buf;
            pnVar5 = pnVar12->file;
            if ((pnVar5 == (ngx_file_t *)0x0) || ((pnVar5->field_0xc0 & 2) == 0)) {
LAB_001162b3:
              pnVar6 = *ppnVar8;
              if (pnVar6 == (ngx_chain_t *)0x0) {
                if ((local_48 != (ngx_chain_t *)0x0) ||
                   (lVar18 = (pnVar24->bufs).num, pnVar24->allocated == lVar18)) {
                  out._4_4_ = 0;
                  break;
                }
                uVar26 = (pnVar24->bufs).size;
                uVar9 = 8;
                if ((pnVar11->buf->field_0x49 & 1) != 0) {
                  if ((long)size < (long)uVar26) {
                    uVar9 = 0;
                    uVar26 = size;
                  }
                  else if ((lVar18 == 1) && ((pnVar24->field_0x20 & 2) == 0)) {
                    lVar18 = (uVar26 >> 2) + uVar26;
                    uVar29 = size;
                    if (lVar18 <= (long)size) {
                      uVar29 = uVar26;
                    }
                    uVar9 = (ushort)(lVar18 <= (long)size) << 3;
                    uVar26 = uVar29;
                  }
                }
                pnVar12 = (ngx_buf_t *)ngx_pcalloc(pnVar24->pool,0x50);
                if (pnVar12 == (ngx_buf_t *)0x0) {
                  return -1;
                }
                if ((pnVar24->field_0x20 & 2) == 0) {
                  puVar13 = (u_char *)ngx_palloc(pnVar24->pool,uVar26);
                }
                else {
                  puVar13 = (u_char *)ngx_pmemalign(pnVar24->pool,uVar26,pnVar24->alignment);
                }
                pnVar12->start = puVar13;
                if (puVar13 == (u_char *)0x0) {
                  return -1;
                }
                pnVar12->pos = puVar13;
                pnVar12->last = puVar13;
                pnVar12->end = puVar13 + uVar26;
                uVar16 = (ushort)*(undefined4 *)&pnVar12->field_0x48;
                *(ushort *)&pnVar12->field_0x48 = uVar16 | 1;
                pnVar12->tag = local_38->tag;
                *(ushort *)&pnVar12->field_0x48 = uVar9 | uVar16 & 0xfff7 | 1;
                local_38->buf = pnVar12;
                local_38->allocated = local_38->allocated + 1;
                pnVar24 = local_38;
              }
              else {
                pnVar12 = pnVar6->buf;
                pnVar24->buf = pnVar12;
                pnVar24->free = pnVar6->next;
                pnVar3 = pnVar24->pool;
                pnVar6->next = pnVar3->chain;
                pnVar3->chain = pnVar6;
              }
            }
            else {
              pnVar24->field_0x20 = pnVar24->field_0x20 | 2;
              uVar26 = pnVar24->alignment - 1U & pnVar12->file_pos;
              if (uVar26 == 0) {
                if ((long)(pnVar24->bufs).size <= (long)size) goto LAB_001162b3;
              }
              else {
                sVar20 = pnVar24->alignment - uVar26;
                if ((long)sVar20 < (long)size) {
                  size = sVar20;
                }
              }
              pnVar12 = ngx_create_temp_buf(pnVar24->pool,size);
              pnVar24->buf = pnVar12;
              if (pnVar12 == (ngx_buf_t *)0x0) {
                return -1;
              }
            }
          }
          pnVar10 = (*ppnVar1)->buf;
          uVar9 = *(ushort *)&pnVar10->field_0x48;
          if ((uVar9 & 7) == 0) {
            sVar21 = pnVar10->file_last - pnVar10->file_pos;
          }
          else {
            sVar21 = (long)pnVar10->last - (long)pnVar10->pos;
          }
          puVar13 = pnVar12->pos;
          size_00 = (long)pnVar12->end - (long)puVar13;
          if ((long)sVar21 < (long)size_00) {
            size_00 = sVar21;
          }
          bVar31 = (pnVar24->field_0x20 & 3) == 1;
          if (((uVar9 & 0x10) != 0) && (0x7fffffff < pnVar10->file_pos)) {
            bVar31 = false;
          }
          if ((uVar9 & 7) == 0) {
            sVar21 = ngx_read_file(pnVar10->file,puVar13,size_00,pnVar10->file_pos);
            if (sVar21 == 0xffffffffffffffff) {
              return -1;
            }
            if (sVar21 != size_00) {
              pnVar4 = local_38->pool->log;
              if (1 < pnVar4->log_level) {
                ngx_log_error_core(2,pnVar4,0,"pread() read only %z of %O from \"%s\"",sVar21,
                                   size_00,(pnVar10->file->name).data);
                return -1;
              }
              return -1;
            }
            pnVar12->last = pnVar12->last + size_00;
            if (bVar31) {
              *(ushort *)&pnVar12->field_0x48 = *(ushort *)&pnVar12->field_0x48 | 0x10;
              pnVar12->file = pnVar10->file;
              lVar18 = pnVar10->file_pos;
              pnVar12->file_pos = lVar18;
              lVar18 = size_00 + lVar18;
              pnVar12->file_last = lVar18;
            }
            else {
              *(ushort *)&pnVar12->field_0x48 = *(ushort *)&pnVar12->field_0x48 & 0xffef;
              lVar18 = size_00 + pnVar10->file_pos;
            }
            pnVar10->file_pos = lVar18;
            if (lVar18 == pnVar10->file_last) goto LAB_0011658c;
          }
          else {
            memcpy(puVar13,pnVar10->pos,size_00);
            pnVar10->pos = pnVar10->pos + size_00;
            pnVar12->last = pnVar12->last + size_00;
            if ((pnVar10->field_0x48 & 0x10) == 0) {
              pnVar12->field_0x48 = pnVar12->field_0x48 & 0xef;
            }
            else {
              if (bVar31) {
                *(ushort *)&pnVar12->field_0x48 = *(ushort *)&pnVar12->field_0x48 | 0x10;
                pnVar12->file = pnVar10->file;
                lVar18 = pnVar10->file_pos;
                pnVar12->file_pos = lVar18;
                oVar30 = size_00 + lVar18;
                pnVar12->file_last = oVar30;
              }
              else {
                *(ushort *)&pnVar12->field_0x48 = *(ushort *)&pnVar12->field_0x48 & 0xffef;
                oVar30 = size_00 + pnVar10->file_pos;
              }
              pnVar10->file_pos = oVar30;
            }
            if (pnVar10->pos == pnVar10->last) {
LAB_0011658c:
              puVar14 = &pnVar12->field_0x48;
              uVar16 = *(ushort *)&pnVar10->field_0x48 & 0x20;
              uVar9 = (ushort)*(undefined4 *)puVar14;
              *(ushort *)puVar14 = uVar9 & 0xffdf | uVar16;
              uVar17 = *(ushort *)&pnVar10->field_0x48 & 0x80;
              *(ushort *)puVar14 = uVar9 & 0xff5f | uVar16 | uVar17;
              *(ushort *)puVar14 =
                   uVar9 & 0xfe5f | uVar16 | uVar17 | *(ushort *)&pnVar10->field_0x48 & 0x100;
            }
          }
          pnVar22 = local_38;
          pnVar12 = (*ppnVar1)->buf;
          if ((pnVar12->field_0x48 & 7) == 0) {
            lVar18 = pnVar12->file_last - pnVar12->file_pos;
          }
          else {
            lVar18 = (long)pnVar12->last - (long)pnVar12->pos;
          }
          if (lVar18 == 0) {
            *ppnVar1 = (*ppnVar1)->next;
          }
          pnVar11 = ngx_alloc_chain_link(local_38->pool);
          if (pnVar11 == (ngx_chain_t *)0x0) {
            return -1;
          }
          pnVar11->buf = pnVar22->buf;
          ppnVar19 = &pnVar11->next;
          pnVar11->next = (ngx_chain_t *)0x0;
          pnVar24 = pnVar22;
          goto LAB_00116621;
        }
LAB_0011622f:
        bVar32 = pnVar24->field_0x20;
        uVar16 = uVar9;
        if ((bVar32 & 1) == 0) {
LAB_0011624f:
          if ((uVar9 & 7) == 0) goto LAB_0011628f;
          *(ushort *)&pnVar12->field_0x48 = uVar9 & 0xffef;
          bVar32 = pnVar24->field_0x20;
          uVar16 = uVar9 & 0xffef;
        }
        if ((((uVar9 & 7) == 0 & (bVar32 & 8) >> 3) != 0) ||
           (((uVar16 & 6) != 0 & (bVar32 & 0x10) >> 4) != 0)) goto LAB_0011628f;
        pnVar11 = *ppnVar1;
      }
LAB_00116217:
      ppnVar19 = &pnVar11->next;
      *ppnVar1 = pnVar11->next;
      pnVar22 = (ngx_output_chain_ctx_t *)ppnVar19;
LAB_00116621:
      *ppnVar7 = pnVar11;
      pnVar22->buf = (ngx_buf_t *)0x0;
      ppnVar7 = ppnVar19;
      pnVar11 = pnVar24->in;
    }
LAB_0011663c:
    in_RCX = &local_48;
    if (local_68 != 1 && local_48 == (ngx_chain_t *)0x0) {
      nVar15 = -2;
      if (out._4_1_ != '\0') {
        nVar15 = local_68;
      }
      return nVar15;
    }
    local_68 = (*pnVar24->output_filter)(pnVar24->filter_ctx,local_48);
    if (local_68 == -4) {
      return -4;
    }
    if (local_68 == -1) {
      return -1;
    }
    ngx_chain_update_chains(pnVar24->pool,ppnVar8,ppnVar23,in_RCX,pnVar24->tag);
  } while( true );
}

Assistant:

ngx_int_t
ngx_output_chain(ngx_output_chain_ctx_t *ctx, ngx_chain_t *in)
{
    off_t         bsize;
    ngx_int_t     rc, last;
    ngx_chain_t  *cl, *out, **last_out;

    if (ctx->in == NULL && ctx->busy == NULL
#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        && !ctx->aio
#endif
       )
    {
        /*
         * the short path for the case when the ctx->in and ctx->busy chains
         * are empty, the incoming chain is empty too or has the single buf
         * that does not require the copy
         */

        if (in == NULL) {
            return ctx->output_filter(ctx->filter_ctx, in);
        }

        if (in->next == NULL
#if (NGX_SENDFILE_LIMIT)
            && !(in->buf->in_file && in->buf->file_last > NGX_SENDFILE_LIMIT)
#endif
            && ngx_output_chain_as_is(ctx, in->buf))
        {
            return ctx->output_filter(ctx->filter_ctx, in);
        }
    }

    /* add the incoming buf to the chain ctx->in */

    if (in) {
        if (ngx_output_chain_add_copy(ctx->pool, &ctx->in, in) == NGX_ERROR) {
            return NGX_ERROR;
        }
    }

    out = NULL;
    last_out = &out;
    last = NGX_NONE;

    for ( ;; ) {

#if (NGX_HAVE_FILE_AIO || NGX_THREADS)
        if (ctx->aio) {
            return NGX_AGAIN;
        }
#endif

        while (ctx->in) {

            /*
             * cycle while there are the ctx->in bufs
             * and there are the free output bufs to copy in
             */

            bsize = ngx_buf_size(ctx->in->buf);

            if (bsize == 0 && !ngx_buf_special(ctx->in->buf)) {

                ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                              "zero size buf in output "
                              "t:%d r:%d f:%d %p %p-%p %p %O-%O",
                              ctx->in->buf->temporary,
                              ctx->in->buf->recycled,
                              ctx->in->buf->in_file,
                              ctx->in->buf->start,
                              ctx->in->buf->pos,
                              ctx->in->buf->last,
                              ctx->in->buf->file,
                              ctx->in->buf->file_pos,
                              ctx->in->buf->file_last);

                ngx_debug_point();

                ctx->in = ctx->in->next;

                continue;
            }

            if (ngx_output_chain_as_is(ctx, ctx->in->buf)) {

                /* move the chain link to the output chain */

                cl = ctx->in;
                ctx->in = cl->next;

                *last_out = cl;
                last_out = &cl->next;
                cl->next = NULL;

                continue;
            }

            if (ctx->buf == NULL) {

                rc = ngx_output_chain_align_file_buf(ctx, bsize);

                if (rc == NGX_ERROR) {
                    return NGX_ERROR;
                }

                if (rc != NGX_OK) {

                    if (ctx->free) {

                        /* get the free buf */

                        cl = ctx->free;
                        ctx->buf = cl->buf;
                        ctx->free = cl->next;

                        ngx_free_chain(ctx->pool, cl);

                    } else if (out || ctx->allocated == ctx->bufs.num) {

                        break;

                    } else if (ngx_output_chain_get_buf(ctx, bsize) != NGX_OK) {
                        return NGX_ERROR;
                    }
                }
            }

            rc = ngx_output_chain_copy_buf(ctx);

            if (rc == NGX_ERROR) {
                return rc;
            }

            if (rc == NGX_AGAIN) {
                if (out) {
                    break;
                }

                return rc;
            }

            /* delete the completed buf from the ctx->in chain */

            if (ngx_buf_size(ctx->in->buf) == 0) {
                ctx->in = ctx->in->next;
            }

            cl = ngx_alloc_chain_link(ctx->pool);
            if (cl == NULL) {
                return NGX_ERROR;
            }

            cl->buf = ctx->buf;
            cl->next = NULL;
            *last_out = cl;
            last_out = &cl->next;
            ctx->buf = NULL;
        }

        if (out == NULL && last != NGX_NONE) {

            if (ctx->in) {
                return NGX_AGAIN;
            }

            return last;
        }

        last = ctx->output_filter(ctx->filter_ctx, out);

        if (last == NGX_ERROR || last == NGX_DONE) {
            return last;
        }

        ngx_chain_update_chains(ctx->pool, &ctx->free, &ctx->busy, &out,
                                ctx->tag);
        last_out = &out;
    }
}